

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O0

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar9;
  int j;
  float *outptr;
  int i;
  float *sptr;
  int q;
  int sw;
  int sh;
  Mat m;
  int p;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_1;
  Mat *m_2;
  Allocator *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  Mat *in_stack_fffffffffffffd10;
  int local_2bc;
  undefined4 *local_2b8;
  int local_2b0;
  undefined4 *local_258;
  int local_24c;
  int local_248;
  int local_244;
  int local_1f8;
  int local_1ac;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar7 = in_RSI[6];
  iVar8 = (int)in_RSI[7] / (*(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd0));
  Mat::create(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
              (int)in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
              in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  bVar9 = true;
  if (*in_RDX != 0) {
    bVar9 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
  }
  if (bVar9) {
    local_1ac = -100;
  }
  else {
    for (local_1f8 = 0; local_1f8 < iVar8; local_1f8 = local_1f8 + 1) {
      iVar2 = *(int *)((long)in_RDX + 0x2c);
      lVar3 = *in_RDX;
      lVar4 = in_RDX[8];
      lVar5 = in_RDX[2];
      lVar6 = in_RDX[2];
      for (local_244 = 0; local_244 < *(int *)(in_RDI + 0xd0); local_244 = local_244 + 1) {
        for (local_248 = 0; local_248 < *(int *)(in_RDI + 0xd0); local_248 = local_248 + 1) {
          if (*(int *)(in_RDI + 0xd4) == 0) {
            local_24c = local_1f8 * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd0) +
                        local_244 * *(int *)(in_RDI + 0xd0) + local_248;
          }
          else {
            local_24c = (local_244 * *(int *)(in_RDI + 0xd0) + local_248) * iVar8 + local_1f8;
          }
          local_258 = (undefined4 *)(*in_RSI + in_RSI[8] * (long)local_24c * in_RSI[2]);
          for (local_2b0 = 0; local_2b0 < (int)lVar7; local_2b0 = local_2b0 + 1) {
            local_2b8 = (undefined4 *)
                        (lVar3 + lVar4 * local_1f8 * lVar5 +
                         (long)iVar2 * (long)(local_2b0 * *(int *)(in_RDI + 0xd0) + local_244) *
                         lVar6 + (long)local_248 * 4);
            for (local_2bc = 0; local_2bc < iVar1; local_2bc = local_2bc + 1) {
              *local_2b8 = *local_258;
              local_258 = local_258 + 1;
              local_2b8 = local_2b8 + *(int *)(in_RDI + 0xd0);
            }
          }
        }
      }
    }
    local_1ac = 0;
  }
  return local_1ac;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                int q;
                if (mode == 0)
                    q = p * upscale_factor * upscale_factor + sh * upscale_factor + sw;
                else // if (mode == 1)
                    q = (sh * upscale_factor + sw) * outc + p;

                const float* sptr = bottom_blob.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i * upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}